

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeMSRSystemRegister(MCInst *Inst,uint Imm,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  char local_b8 [8];
  char result [128];
  _Bool local_29;
  void *pvStack_28;
  _Bool ValidNamed;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_10;
  uint Imm_local;
  MCInst *Inst_local;
  
  Address_local._4_4_ = Imm | 0x8000;
  pvStack_28 = Decoder;
  Decoder_local = (void *)Address;
  pMStack_10 = Inst;
  MCOperand_CreateImm0(Inst,(ulong)Address_local._4_4_);
  A64SysRegMapper_toString(&AArch64_MSRMapper,Address_local._4_4_,&local_29,local_b8);
  DVar1 = MCDisassembler_Fail;
  if ((local_29 & 1U) != 0) {
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeMSRSystemRegister(MCInst *Inst, unsigned Imm,
		uint64_t Address,
		void *Decoder)
{
	bool ValidNamed;
	char result[128];

	Imm |= 0x8000;
	MCOperand_CreateImm0(Inst, Imm);

	A64SysRegMapper_toString(&AArch64_MSRMapper, Imm, &ValidNamed, result);

	return ValidNamed ? Success : Fail;
}